

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_session.hpp
# Opt level: O0

SessionWriter * binlog::default_thread_local_writer(void)

{
  long *in_FS_OFFSET;
  string *in_stack_00000050;
  uint64_t in_stack_00000058;
  size_t in_stack_00000060;
  Session *in_stack_00000068;
  SessionWriter *in_stack_00000070;
  string local_20 [32];
  
  if ((char)in_FS_OFFSET[-1] == '\0') {
    default_session();
    detail::this_thread_id_string_abi_cxx11_();
    SessionWriter::SessionWriter
              (in_stack_00000070,in_stack_00000068,in_stack_00000060,in_stack_00000058,
               in_stack_00000050);
    std::__cxx11::string::~string(local_20);
    __cxa_thread_atexit(SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,&__dso_handle);
    *(undefined1 *)(in_FS_OFFSET + -1) = 1;
  }
  return (SessionWriter *)(*in_FS_OFFSET + -0x38);
}

Assistant:

inline SessionWriter& default_thread_local_writer()
{
  static thread_local SessionWriter s_writer(
    default_session(),
    1 << 20, // queue capacity
    0,       // writer id
    detail::this_thread_id_string() // writer name
  );
  return s_writer;
}